

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source,real s)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  size_t sVar5;
  undefined1 in_register_00001204 [12];
  
  sVar1 = (this->data_).size_;
  if (sVar1 == (source->data_).size_) {
    if (0 < (long)sVar1) {
      pfVar2 = (source->data_).mem_;
      pfVar3 = (this->data_).mem_;
      sVar5 = 0;
      do {
        auVar4._4_12_ = in_register_00001204;
        auVar4._0_4_ = s;
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[sVar5]),auVar4,ZEXT416((uint)pfVar3[sVar5]));
        pfVar3[sVar5] = auVar4._0_4_;
        sVar5 = sVar5 + 1;
      } while (sVar1 != sVar5);
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                ,0x30,"void fasttext::Vector::addVector(const Vector &, real)");
}

Assistant:

void Vector::addVector(const Vector& source, real s) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += s * source.data_[i];
  }
}